

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

void lddmc_serialize_fromfile(FILE *in)

{
  undefined8 uVar1;
  uint6 uVar2;
  size_t sVar3;
  MDD ifneq;
  MDD ifeq;
  ulong uVar4;
  mddnode node;
  size_t count;
  int local_6c;
  ulong local_68;
  FILE *local_60;
  uint6 local_58;
  undefined2 uStack_52;
  undefined2 uStack_50;
  uint6 uStack_4e;
  ulong local_48;
  lddmc_ser local_40;
  
  local_60 = (FILE *)in;
  sVar3 = fread(&local_48,8,1,(FILE *)in);
  if (sVar3 == 1) {
    local_68 = local_48;
    if (local_48 != 0) {
      uVar4 = 1;
      do {
        sVar3 = fread(&local_58,0x10,1,local_60);
        if (sVar3 != 1) goto LAB_001196ce;
        if (lddmc_ser_done + 1 < (ulong)(local_58 >> 1)) {
          __assert_fail("mddnode_getright(&node) <= lddmc_ser_done+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                        ,0xa29,"void lddmc_serialize_fromfile(FILE *)");
        }
        uVar1 = CONCAT62(uStack_4e,uStack_50);
        uVar2 = uStack_4e >> 1;
        if (lddmc_ser_done + 1 < (ulong)uVar2) {
          __assert_fail("mddnode_getdown(&node) <= lddmc_ser_done+1",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                        ,0xa2a,"void lddmc_serialize_fromfile(FILE *)");
        }
        ifneq = lddmc_serialize_get_reversed((ulong)(local_58 >> 1));
        ifeq = lddmc_serialize_get_reversed((ulong)uVar2);
        if (((uint)uVar1 >> 0x10 & 1) == 0) {
          local_40.mdd = lddmc_makenode(CONCAT22(uStack_50,uStack_52),ifeq,ifneq);
        }
        else {
          local_40.mdd = lddmc_make_copynode(ifeq,ifneq);
        }
        local_6c = 0;
        local_40.assigned = lddmc_ser_done + 2;
        lddmc_ser_done = lddmc_ser_done + 1;
        lddmc_ser_put(&lddmc_ser_set,&local_40,&local_6c);
        local_6c = 0;
        lddmc_ser_reversed_put(&lddmc_ser_reversed_set,&local_40,&local_6c);
        uVar4 = uVar4 + 1;
      } while (uVar4 <= local_68);
    }
    return;
  }
LAB_001196ce:
  puts("sylvan_serialize_fromfile: file format error, giving up");
  exit(-1);
}

Assistant:

void
lddmc_serialize_fromfile(FILE *in)
{
    size_t count, i;
    if (fread(&count, sizeof(size_t), 1, in) != 1) {
        // TODO FIXME return error
        printf("sylvan_serialize_fromfile: file format error, giving up\n");
        exit(-1);
    }

    for (i=1; i<=count; i++) {
        struct mddnode node;
        if (fread(&node, sizeof(struct mddnode), 1, in) != 1) {
            // TODO FIXME return error
            printf("sylvan_serialize_fromfile: file format error, giving up\n");
            exit(-1);
        }

        assert(mddnode_getright(&node) <= lddmc_ser_done+1);
        assert(mddnode_getdown(&node) <= lddmc_ser_done+1);

        MDD right = lddmc_serialize_get_reversed(mddnode_getright(&node));
        MDD down = lddmc_serialize_get_reversed(mddnode_getdown(&node));

        struct lddmc_ser s;
        if (mddnode_getcopy(&node)) s.mdd = lddmc_make_copynode(down, right);
        else s.mdd = lddmc_makenode(mddnode_getvalue(&node), down, right);
        s.assigned = lddmc_ser_done+2; // starts at 0 but we want 2-based...
        lddmc_ser_done++;

        lddmc_ser_insert(&lddmc_ser_set, &s);
        lddmc_ser_reversed_insert(&lddmc_ser_reversed_set, &s);
    }
}